

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O1

LPCVOID PAL_GetSymbolModuleBase(void *symbol)

{
  int iVar1;
  undefined1 local_30 [8];
  Dl_info info;
  
  if (!PAL_InitializeChakraCoreCalled) goto LAB_001ceb98;
  if (symbol == (void *)0x0) {
LAB_001ceb80:
    SetLastError(0xd);
    info.dli_fname = (char *)0x0;
  }
  else {
    iVar1 = dladdr(symbol,local_30);
    if (iVar1 == 0) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_001ceb98;
      goto LAB_001ceb80;
    }
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    return info.dli_fname;
  }
LAB_001ceb98:
  abort();
}

Assistant:

LPCVOID
PALAPI
PAL_GetSymbolModuleBase(void *symbol)
{
    LPCVOID retval = nullptr;

    PERF_ENTRY(PAL_GetPalModuleBase);
    ENTRY("PAL_GetPalModuleBase\n");

    if (symbol == nullptr)
    {
        TRACE("Can't get base address. Argument symbol == nullptr\n");
        SetLastError(ERROR_INVALID_DATA);
    }
    else
    {
        Dl_info info;
        if (dladdr(symbol, &info) != 0)
        {
            retval = info.dli_fbase;
        }
        else
        {
            TRACE("Can't get base address of the current module\n");
            SetLastError(ERROR_INVALID_DATA);
        }
    }

    LOGEXIT("PAL_GetPalModuleBase returns %p\n", retval);
    PERF_EXIT(PAL_GetPalModuleBase);
    return retval;
}